

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

deUint32 tcu::astc::anon_unknown_0::computeISERangeMax(ISEParams *iseParams)

{
  ISEMode IVar1;
  ISEParams *iseParams_local;
  
  IVar1 = iseParams->mode;
  if (IVar1 == ISEMODE_TRIT) {
    iseParams_local._4_4_ = (1 << ((byte)iseParams->numBits & 0x1f)) * 3 - 1;
  }
  else if (IVar1 == ISEMODE_QUINT) {
    iseParams_local._4_4_ = (1 << ((byte)iseParams->numBits & 0x1f)) * 5 - 1;
  }
  else if (IVar1 == ISEMODE_PLAIN_BIT) {
    iseParams_local._4_4_ = (1 << ((byte)iseParams->numBits & 0x1f)) - 1;
  }
  else {
    iseParams_local._4_4_ = 0xffffffff;
  }
  return iseParams_local._4_4_;
}

Assistant:

static inline deUint32 computeISERangeMax (const ISEParams& iseParams)
{
	switch (iseParams.mode)
	{
		case ISEMODE_TRIT:			return (1u << iseParams.numBits) * 3 - 1;
		case ISEMODE_QUINT:			return (1u << iseParams.numBits) * 5 - 1;
		case ISEMODE_PLAIN_BIT:		return (1u << iseParams.numBits)     - 1;
		default:
			DE_ASSERT(false);
			return -1;
	}
}